

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

void __thiscall
flexbuffers::Reference::ToString
          (Reference *this,bool strings_quoted,bool keys_quoted,string *s,bool indented,
          int cur_indent,char *indent_string,bool natural_utf8)

{
  byte bVar1;
  char cVar2;
  Type TVar3;
  int64_t t;
  uint64_t t_00;
  long lVar4;
  char *pcVar5;
  ulong *puVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  bool keys_quoted_00;
  uint uVar10;
  double t_01;
  TypedVector keys;
  size_t len;
  Map m;
  string local_b0;
  uint8_t *local_90;
  ulong local_88;
  int local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  ulong local_70;
  ulong local_68;
  Reference local_60;
  uint8_t *local_50;
  Map local_48;
  
  TVar3 = this->type_;
  switch(TVar3) {
  case FBT_NULL:
    break;
  case FBT_INT:
  case FBT_INDIRECT_INT:
    t = AsInt64(this);
    flatbuffers::NumToString<long>(&local_b0,t);
    std::__cxx11::string::_M_append((char *)s,(ulong)local_b0._M_dataplus._M_p);
    goto LAB_0015cfb1;
  case FBT_UINT:
  case FBT_INDIRECT_UINT:
    t_00 = AsUInt64(this);
    flatbuffers::NumToString<unsigned_long>(&local_b0,t_00);
    std::__cxx11::string::_M_append((char *)s,(ulong)local_b0._M_dataplus._M_p);
    goto LAB_0015cfb1;
  case FBT_FLOAT:
  case FBT_INDIRECT_FLOAT:
    t_01 = AsDouble(this);
    flatbuffers::FloatToString<double>(&local_b0,t_01,0xc);
    std::__cxx11::string::_M_append((char *)s,(ulong)local_b0._M_dataplus._M_p);
LAB_0015cfb1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    return;
  case FBT_KEY:
    if ((TVar3 & ~FBT_INT) == FBT_KEY) {
      puVar6 = (ulong *)this->data_;
      bVar1 = this->parent_width_;
      if (bVar1 < 4) {
        if (bVar1 < 2) {
          uVar9 = (ulong)(byte)*puVar6;
        }
        else {
          uVar9 = (ulong)(ushort)*puVar6;
        }
      }
      else if (bVar1 < 8) {
        uVar9 = (ulong)(uint)*puVar6;
      }
      else {
        uVar9 = *puVar6;
      }
      pcVar5 = (char *)((long)puVar6 - uVar9);
    }
    else {
      pcVar5 = "";
    }
    if (keys_quoted) {
      uVar9 = strlen(pcVar5);
      goto LAB_0015d557;
    }
    break;
  case FBT_STRING:
    puVar6 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar9 = (ulong)(byte)*puVar6;
      }
      else {
        uVar9 = (ulong)(ushort)*puVar6;
      }
    }
    else if (bVar1 < 8) {
      uVar9 = (ulong)(uint)*puVar6;
    }
    else {
      uVar9 = *puVar6;
    }
    pcVar5 = (char *)((long)puVar6 - uVar9);
    bVar1 = this->byte_width_;
    lVar4 = -(ulong)bVar1;
    if ((ulong)bVar1 < 4) {
      if (bVar1 < 2) {
        uVar9 = (ulong)(byte)pcVar5[lVar4];
      }
      else {
        uVar9 = (ulong)*(ushort *)(pcVar5 + lVar4);
      }
    }
    else if (bVar1 < 8) {
      uVar9 = (ulong)*(uint *)(pcVar5 + lVar4);
    }
    else {
      uVar9 = *(ulong *)(pcVar5 + lVar4);
    }
    if (!strings_quoted) {
      std::__cxx11::string::append((char *)s,(ulong)pcVar5);
      return;
    }
LAB_0015d557:
    flatbuffers::EscapeString(pcVar5,uVar9,s,true,natural_utf8);
    return;
  case FBT_MAP:
    std::__cxx11::string::append((char *)s);
    std::__cxx11::string::append((char *)s);
    AsMap(&local_48,this);
    Map::Keys((TypedVector *)&local_b0,&local_48);
    local_90 = local_48.super_Vector.super_Sized.super_Object.data_;
    local_68 = (ulong)local_48.super_Vector.super_Sized.super_Object.byte_width_;
    lVar4 = -local_68;
    if (local_68 < 4) {
      if (local_48.super_Vector.super_Sized.super_Object.byte_width_ < 2) {
        local_88 = (ulong)local_48.super_Vector.super_Sized.super_Object.data_[lVar4];
      }
      else {
        local_88 = (ulong)*(ushort *)(local_48.super_Vector.super_Sized.super_Object.data_ + lVar4);
      }
    }
    else if (local_48.super_Vector.super_Sized.super_Object.byte_width_ < 8) {
      local_88 = (ulong)*(uint *)(local_48.super_Vector.super_Sized.super_Object.data_ + lVar4);
    }
    else {
      local_88 = *(ulong *)(local_48.super_Vector.super_Sized.super_Object.data_ + lVar4);
    }
    local_70 = (ulong)(uint)cur_indent;
    if (local_b0.field_2._M_allocated_capacity != 0) {
      local_50 = local_48.super_Vector.super_Sized.super_Object.data_ + local_88 * local_68;
      local_80 = cur_indent + 1;
      uVar9 = 0;
      local_74 = (uint)natural_utf8;
      local_7c = (uint)indented;
      local_78 = (uint)keys_quoted;
      do {
        keys_quoted_00 = keys_quoted;
        if (!keys_quoted) {
          pcVar5 = "";
          if ((local_b0.field_2._8_4_ & 0xfffffffe) == 4) {
            puVar6 = (ulong *)(local_b0._M_dataplus._M_p + (byte)local_b0._M_string_length * uVar9);
            if ((byte)local_b0._M_string_length < 4) {
              if ((byte)local_b0._M_string_length < 2) {
                uVar8 = (ulong)(byte)*puVar6;
              }
              else {
                uVar8 = (ulong)(ushort)*puVar6;
              }
            }
            else if ((byte)local_b0._M_string_length < 8) {
              uVar8 = (ulong)(uint)*puVar6;
            }
            else {
              uVar8 = *puVar6;
            }
            pcVar5 = (char *)((long)puVar6 - uVar8);
          }
          if (((int)*pcVar5 == 0x5f) ||
             (keys_quoted_00 = true, ((int)*pcVar5 & 0xffffffdfU) - 0x41 < 0x1a)) {
            pcVar5 = pcVar5 + 1;
            do {
              cVar2 = *pcVar5;
              keys_quoted_00 = keys_quoted;
              if (cVar2 == '\0') break;
              pcVar5 = pcVar5 + 1;
            } while (((cVar2 == '_') || (((int)cVar2 & 0xffffffdfU) - 0x41 < 0x1a)) ||
                    (keys_quoted_00 = true, (int)cVar2 - 0x30U < 10));
          }
        }
        iVar7 = local_80;
        if (-1 < cur_indent && indented) {
          do {
            std::__cxx11::string::append((char *)s);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        uVar8 = 0x101;
        if (uVar9 < (ulong)local_b0.field_2._0_8_) {
          local_60.data_ =
               (uint8_t *)(local_b0._M_dataplus._M_p + uVar9 * (byte)local_b0._M_string_length);
          local_60._8_8_ =
               (ulong)(byte)local_b0._M_string_length +
               ((ulong)(uint)local_b0.field_2._8_4_ << 0x20) + 0x100;
        }
        else {
          local_60.data_ = (uint8_t *)0x0;
          local_60._8_8_ = 0x101;
        }
        ToString(&local_60,true,keys_quoted_00,s,false,0,"",false);
        std::__cxx11::string::append((char *)s);
        if (uVar9 < local_88) {
          local_60.data_ = local_90 + uVar9 * local_68;
          uVar8 = (1L << (local_50[uVar9] & 3)) << 8 | (ulong)(local_50[uVar9] >> 2) << 0x20 |
                  local_68;
        }
        else {
          local_60.data_ = (uint8_t *)0x0;
        }
        local_60._8_8_ = uVar8;
        ToString(&local_60,true,SUB41(local_78,0),s,SUB41(local_7c,0),local_80,indent_string,
                 SUB41(local_74,0));
        if (uVar9 < local_b0.field_2._M_allocated_capacity - 1) {
          std::__cxx11::string::append((char *)s);
          if (!indented) {
            std::__cxx11::string::append((char *)s);
            goto LAB_0015d3f7;
          }
LAB_0015d3fc:
          std::__cxx11::string::append((char *)s);
        }
        else {
LAB_0015d3f7:
          if (indented) goto LAB_0015d3fc;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < local_b0.field_2._M_allocated_capacity);
    }
    if (indented) {
      uVar9 = local_70;
      if (0 < (int)local_70) {
        do {
          std::__cxx11::string::append((char *)s);
          uVar10 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
    }
    else {
      std::__cxx11::string::append((char *)s);
    }
    std::__cxx11::string::append((char *)s);
    return;
  default:
    if (TVar3 - FBT_MAP < 2) {
      AsVector((Vector *)&local_b0,this);
      AppendToString<flexbuffers::Vector>
                (s,(Vector *)&local_b0,keys_quoted,indented,cur_indent + 1,indent_string,
                 natural_utf8);
      return;
    }
    if ((TVar3 - FBT_VECTOR_INT < 5) || (TVar3 == FBT_VECTOR_BOOL)) {
      AsTypedVector((TypedVector *)&local_b0,this);
      AppendToString<flexbuffers::TypedVector>
                (s,(TypedVector *)&local_b0,keys_quoted,indented,cur_indent + 1,indent_string,
                 natural_utf8);
      return;
    }
    if (TVar3 - FBT_VECTOR_INT2 < 9) {
      AsFixedTypedVector((FixedTypedVector *)&local_b0,this);
      AppendToString<flexbuffers::FixedTypedVector>
                (s,(FixedTypedVector *)&local_b0,keys_quoted,indented,cur_indent + 1,indent_string,
                 natural_utf8);
      return;
    }
    if (TVar3 == FBT_BLOB) {
      AsBlob((Blob *)&local_b0,this);
      flatbuffers::EscapeString
                (local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity,s,true,false);
      return;
    }
    break;
  case FBT_BOOL:
    AsBool(this);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void ToString(bool strings_quoted, bool keys_quoted, std::string &s,
                bool indented, int cur_indent, const char *indent_string,
                bool natural_utf8 = false) const {
    if (type_ == FBT_STRING) {
      String str(Indirect(), byte_width_);
      if (strings_quoted) {
        flatbuffers::EscapeString(str.c_str(), str.length(), &s, true, natural_utf8);
      } else {
        s.append(str.c_str(), str.length());
      }
    } else if (IsKey()) {
      auto str = AsKey();
      if (keys_quoted) {
        flatbuffers::EscapeString(str, strlen(str), &s, true, natural_utf8);
      } else {
        s += str;
      }
    } else if (IsInt()) {
      s += flatbuffers::NumToString(AsInt64());
    } else if (IsUInt()) {
      s += flatbuffers::NumToString(AsUInt64());
    } else if (IsFloat()) {
      s += flatbuffers::NumToString(AsDouble());
    } else if (IsNull()) {
      s += "null";
    } else if (IsBool()) {
      s += AsBool() ? "true" : "false";
    } else if (IsMap()) {
      s += "{";
      s += indented ? "\n" : " ";
      auto m = AsMap();
      auto keys = m.Keys();
      auto vals = m.Values();
      for (size_t i = 0; i < keys.size(); i++) {
        bool kq = keys_quoted;
        if (!kq) {
          // FlexBuffers keys may contain arbitrary characters, only allow
          // unquoted if it looks like an "identifier":
          const char *p = keys[i].AsKey();
          if (!flatbuffers::is_alpha(*p) && *p != '_') {
            kq = true;
          } else {
            while (*++p) {
              if (!flatbuffers::is_alnum(*p) && *p != '_') {
                kq = true;
                break;
              }
            }
          }
        }
        if (indented) IndentString(s, cur_indent + 1, indent_string);
        keys[i].ToString(true, kq, s);
        s += ": ";
        vals[i].ToString(true, keys_quoted, s, indented, cur_indent + 1, indent_string,
                         natural_utf8);
        if (i < keys.size() - 1) {
          s += ",";
          if (!indented) s += " ";
        }
        if (indented) s += "\n";
      }
      if (!indented) s += " ";
      if (indented) IndentString(s, cur_indent, indent_string);
      s += "}";
    } else if (IsVector()) {
      AppendToString<Vector>(s, AsVector(), keys_quoted, indented,
                             cur_indent + 1, indent_string, natural_utf8);
    } else if (IsTypedVector()) {
      AppendToString<TypedVector>(s, AsTypedVector(), keys_quoted, indented,
                                  cur_indent + 1, indent_string,
                                  natural_utf8);
    } else if (IsFixedTypedVector()) {
      AppendToString<FixedTypedVector>(s, AsFixedTypedVector(), keys_quoted,
                                       indented, cur_indent + 1, indent_string,
                                       natural_utf8);
    } else if (IsBlob()) {
      auto blob = AsBlob();
      flatbuffers::EscapeString(reinterpret_cast<const char *>(blob.data()),
                                blob.size(), &s, true, false);
    } else {
      s += "(?)";
    }
  }